

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.h
# Opt level: O0

void __thiscall hypermind::CompileUnit::DefineVariable(CompileUnit *this,HMInteger index)

{
  Variable local_1c;
  HMInteger local_14;
  CompileUnit *pCStack_10;
  HMInteger index_local;
  CompileUnit *this_local;
  
  if (this->mScopeDepth == -1) {
    local_14 = index;
    pCStack_10 = this;
    Variable::Variable(&local_1c,Module,index);
    EmitStoreVariable(this,&local_1c);
    EmitPop(this);
  }
  return;
}

Assistant:

void DefineVariable(HMInteger index) {
            if (mScopeDepth == -1) {
                // 作用域为模块作用域
                EmitStoreVariable(Variable(ScopeType::Module, index));
                EmitPop();
            } else {
//                EmitStoreVariable(Variable(ScopeType::Local, index));
            }

            // 不是模块作用域 不用管
        }